

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
UnexpectedExceptionFailure::UnexpectedExceptionFailure
          (UnexpectedExceptionFailure *this,UtestShell *test,exception *e)

{
  char *pcVar1;
  undefined8 uVar2;
  SimpleString local_40;
  SimpleString local_30;
  exception *local_20;
  exception *e_local;
  UtestShell *test_local;
  UnexpectedExceptionFailure *this_local;
  
  local_20 = e;
  e_local = (exception *)test;
  test_local = (UtestShell *)this;
  getExceptionTypeName((exception *)&local_40);
  pcVar1 = SimpleString::asCharString(&local_40);
  uVar2 = (**(code **)(*(long *)local_20 + 0x10))();
  StringFromFormat((char *)&local_30,"Unexpected exception of type \'%s\' was thrown: %s",pcVar1,
                   uVar2);
  TestFailure::TestFailure(&this->super_TestFailure,test,&local_30);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_40);
  (this->super_TestFailure)._vptr_TestFailure =
       (_func_int **)&PTR__UnexpectedExceptionFailure_00368d30;
  return;
}

Assistant:

UnexpectedExceptionFailure::UnexpectedExceptionFailure(UtestShell* test, const std::exception &e)
: TestFailure(
    test,
#if CPPUTEST_HAVE_RTTI
    StringFromFormat(
        "Unexpected exception of type '%s' was thrown: %s",
        getExceptionTypeName(e).asCharString(),
        e.what()
    )
#else
    "Unexpected exception of unknown type was thrown."
#endif
)
{
    (void) e;
}